

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadSideDefs2(MapData *map,FMissingTextureTracker *missingtex)

{
  DWORD DVar1;
  int iVar2;
  void *buffer;
  short *psVar3;
  side_t *this;
  long lVar4;
  undefined1 local_58 [8];
  intmapsidedef_t imsd;
  sector_t_conflict *sec;
  side_t *sd;
  mapsidedef_t *msd;
  char *msdf;
  int i;
  FMissingTextureTracker *missingtex_local;
  MapData *map_local;
  
  DVar1 = MapData::Size(map,3);
  buffer = operator_new__((ulong)DVar1);
  MapData::Read(map,3,buffer,-1);
  for (msdf._4_4_ = 0; (int)msdf._4_4_ < numsides; msdf._4_4_ = msdf._4_4_ + 1) {
    psVar3 = (short *)((long)buffer + (ulong)sidetemp[(int)msdf._4_4_].field_0.a.map * 0x1e);
    this = sides + (int)msdf._4_4_;
    if (gameinfo.gametype == GAME_Strife) {
      iVar2 = strncmp((char *)(psVar3 + 10),"LASERB01",8);
      if (iVar2 == 0) {
        psVar3[1] = psVar3[1] + 0x66;
      }
    }
    side_t::SetTextureXOffset(this,(double)(int)*psVar3);
    side_t::SetTextureYOffset(this,(double)(int)psVar3[1]);
    side_t::SetTextureXScale(this,1.0);
    side_t::SetTextureYScale(this,1.0);
    this->linedef = (line_t_conflict *)0x0;
    this->Flags = '\0';
    this->Index = msdf._4_4_;
    if ((uint)(int)psVar3[0xe] < (uint)numsectors) {
      imsd.midtexture.Chars = (char *)(sectors + psVar3[0xe]);
      this->sector = (sector_t_conflict *)imsd.midtexture.Chars;
    }
    else {
      Printf(2,"Sidedef %d has a bad sector\n",(ulong)msdf._4_4_);
      imsd.midtexture.Chars = (char *)0x0;
      this->sector = (sector_t_conflict *)0x0;
    }
    intmapsidedef_t::intmapsidedef_t((intmapsidedef_t *)local_58);
    FString::CopyCStrPart((FString *)local_58,(char *)(psVar3 + 2),8);
    FString::CopyCStrPart(&imsd.bottomtexture,(char *)(psVar3 + 10),8);
    FString::CopyCStrPart(&imsd.toptexture,(char *)(psVar3 + 6),8);
    lVar4 = (long)(int)msdf._4_4_;
    P_ProcessSideTextures
              ((bool)(~map->HasBehavior & 1),this,(sector_t_conflict *)imsd.midtexture.Chars,
               (intmapsidedef_t *)local_58,(int)sidetemp[lVar4].field_0.a.special,
               (int)sidetemp[lVar4].field_0.a.tag,&sidetemp[lVar4].field_0.a.alpha,missingtex);
    intmapsidedef_t::~intmapsidedef_t((intmapsidedef_t *)local_58);
  }
  if (buffer != (void *)0x0) {
    operator_delete__(buffer);
  }
  return;
}

Assistant:

void P_LoadSideDefs2 (MapData *map, FMissingTextureTracker &missingtex)
{
	int  i;
	char * msdf = new char[map->Size(ML_SIDEDEFS)];
	map->Read(ML_SIDEDEFS, msdf);

	for (i = 0; i < numsides; i++)
	{
		mapsidedef_t *msd = ((mapsidedef_t*)msdf) + sidetemp[i].a.map;
		side_t *sd = sides + i;
		sector_t *sec;

		// [RH] The Doom renderer ignored the patch y locations when
		// drawing mid textures. ZDoom does not, so fix the laser beams in Strife.
		if (gameinfo.gametype == GAME_Strife &&
			strncmp (msd->midtexture, "LASERB01", 8) == 0)
		{
			msd->rowoffset += 102;
		}

		sd->SetTextureXOffset(LittleShort(msd->textureoffset));
		sd->SetTextureYOffset(LittleShort(msd->rowoffset));
		sd->SetTextureXScale(1.);
		sd->SetTextureYScale(1.);
		sd->linedef = NULL;
		sd->Flags = 0;
		sd->Index = i;

		// killough 4/4/98: allow sidedef texture names to be overloaded
		// killough 4/11/98: refined to allow colormaps to work as wall
		// textures if invalid as colormaps but valid as textures.

		if ((unsigned)LittleShort(msd->sector)>=(unsigned)numsectors)
		{
			Printf (PRINT_HIGH, "Sidedef %d has a bad sector\n", i);
			sd->sector = sec = NULL;
		}
		else
		{
			sd->sector = sec = &sectors[LittleShort(msd->sector)];
		}

		intmapsidedef_t imsd;
		imsd.toptexture.CopyCStrPart(msd->toptexture, 8);
		imsd.midtexture.CopyCStrPart(msd->midtexture, 8);
		imsd.bottomtexture.CopyCStrPart(msd->bottomtexture, 8);

		P_ProcessSideTextures(!map->HasBehavior, sd, sec, &imsd, 
							  sidetemp[i].a.special, sidetemp[i].a.tag, &sidetemp[i].a.alpha, missingtex);
	}
	delete[] msdf;
}